

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char (*value) [5])

{
  size_t sVar1;
  ostream *poVar2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  
  Message::Message((Message *)&local_20);
  poVar2 = (ostream *)(local_20._M_head_impl + 0x10);
  sVar1 = strlen(*value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,*value,sVar1);
  AppendMessage(this,(Message *)&local_20);
  if (local_20._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_20._M_head_impl + 8))();
  }
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }